

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Own<kj::HttpClient,_std::nullptr_t> __thiscall
kj::newHttpClient(kj *this,Timer *timer,HttpHeaderTable *responseHeaderTable,Network *network,
                 Maybe<kj::Network_&> *tlsNetwork,HttpClientSettings *settings)

{
  WebSocketCompressionMode WVar1;
  Network *pNVar2;
  HttpClientErrorHandler *pHVar3;
  long lVar4;
  EntropySource *pEVar5;
  WebSocketErrorHandler *pWVar6;
  SecureNetworkWrapper *pSVar7;
  SourceLocation location;
  undefined8 *puVar8;
  HttpClient *extraout_RDX;
  Own<kj::HttpClient,_std::nullptr_t> OVar9;
  
  puVar8 = (undefined8 *)operator_new(0xf8);
  pNVar2 = tlsNetwork->ptr;
  lVar4 = (settings->idleTimeout).value;
  pEVar5 = (settings->entropySource).ptr;
  (settings->entropySource).ptr = (EntropySource *)0x0;
  pHVar3 = (settings->errorHandler).ptr;
  (settings->errorHandler).ptr = (HttpClientErrorHandler *)0x0;
  WVar1 = settings->webSocketCompressionMode;
  pWVar6 = (settings->webSocketErrorHandler).ptr;
  pSVar7 = (settings->tlsContext).ptr;
  (settings->webSocketErrorHandler).ptr = (WebSocketErrorHandler *)0x0;
  (settings->tlsContext).ptr = (SecureNetworkWrapper *)0x0;
  *puVar8 = &PTR_request_00640538;
  puVar8[1] = &DAT_00640568;
  puVar8[2] = timer;
  puVar8[3] = responseHeaderTable;
  puVar8[4] = network;
  puVar8[5] = pNVar2;
  puVar8[6] = lVar4;
  puVar8[7] = pEVar5;
  puVar8[8] = pHVar3;
  *(WebSocketCompressionMode *)(puVar8 + 9) = WVar1;
  puVar8[10] = pWVar6;
  puVar8[0xb] = pSVar7;
  *(undefined4 *)(puVar8 + 0xd) = 0;
  puVar8[0xe] = 0;
  puVar8[0xf] = puVar8 + 0xd;
  puVar8[0x10] = puVar8 + 0xd;
  puVar8[0x11] = 0;
  *(undefined4 *)(puVar8 + 0x13) = 0;
  puVar8[0x14] = 0;
  puVar8[0x15] = puVar8 + 0x13;
  puVar8[0x16] = puVar8 + 0x13;
  puVar8[0x17] = 0;
  location.function = "NetworkHttpClient";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x188b;
  location.columnNumber = 9;
  TaskSet::TaskSet((TaskSet *)(puVar8 + 0x18),(ErrorHandler *)(puVar8 + 1),location);
  *(undefined8 **)this = &_::HeapDisposer<kj::(anonymous_namespace)::NetworkHttpClient>::instance;
  *(undefined8 **)(this + 8) = puVar8;
  OVar9.ptr = extraout_RDX;
  OVar9.disposer = (Disposer *)this;
  return OVar9;
}

Assistant:

kj::Own<HttpClient> newHttpClient(kj::Timer& timer, const HttpHeaderTable& responseHeaderTable,
                                  kj::Network& network, kj::Maybe<kj::Network&> tlsNetwork,
                                  HttpClientSettings settings) {
  return kj::heap<NetworkHttpClient>(
      timer, responseHeaderTable, network, tlsNetwork, kj::mv(settings));
}